

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_SetArrayItemC_CI4<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  Var pvVar4;
  JavascriptArray *this_00;
  undefined4 *puVar5;
  Type *pTVar6;
  
  pvVar4 = GetReg<unsigned_short>(this,playout->Instance);
  this_00 = JavascriptArray::FromAnyArray(pvVar4);
  uVar1 = playout->Element;
  pvVar4 = GetReg<unsigned_short>(this,playout->Value);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar4);
  pTVar6 = (this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  if ((((pTVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr !=
      *(ScriptContext **)(this + 0x78)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15bf,"(array->GetScriptContext() == GetScriptContext())",
                                "array->GetScriptContext() == GetScriptContext()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pTVar6 = (this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  }
  if (pTVar6->typeId != TypeIds_ArrayLast) {
    if (pTVar6->typeId == TypeIds_NativeIntArray) {
      JavascriptArray::OP_SetNativeIntElementC
                ((JavascriptNativeIntArray *)this_00,(uint)uVar1,pvVar4,
                 (((pTVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
      ;
      return;
    }
    JavascriptArray::SetArrayLiteralItem<void*>(this_00,(uint)uVar1,pvVar4);
    return;
  }
  JavascriptArray::OP_SetNativeFloatElementC
            ((JavascriptNativeFloatArray *)this_00,(uint)uVar1,pvVar4,
             (((pTVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArrayItemC_CI4(const unaligned T* playout)
    {
        JavascriptArray* array = JavascriptArray::FromAnyArray(GetReg(playout->Instance));
        uint32 index = playout->Element;
        Var value = GetReg(playout->Value);

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(value);
#endif

        // The array is create by the built-in on the same script context
        Assert(array->GetScriptContext() == GetScriptContext());
        TypeId typeId = array->GetTypeId();
        if (typeId == TypeIds_NativeIntArray)
        {
            JavascriptArray::OP_SetNativeIntElementC(reinterpret_cast<JavascriptNativeIntArray*>(array), index, value, array->GetScriptContext());
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            JavascriptArray::OP_SetNativeFloatElementC(reinterpret_cast<JavascriptNativeFloatArray*>(array), index, value, array->GetScriptContext());
        }
        else
        {
            array->SetArrayLiteralItem(index, value);
        }
    }